

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O1

ON_MeshNGonEdge *
ON_MeshNGonEdge::Create
          (ON_MeshNGonEdge *__return_storage_ptr__,uint candidate_sud_face_id,uint mesh_Vi,
          uint mesh_Vj,uint *mesh_point_id)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  if (mesh_Vi != mesh_Vj && candidate_sud_face_id != 0) {
    __return_storage_ptr__->m_sud_face_id = 0;
    __return_storage_ptr__->m_mesh_Vi = 0;
    __return_storage_ptr__->m_mesh_Vj = 0;
    __return_storage_ptr__->m_u_status = '\0';
    *(undefined3 *)&__return_storage_ptr__->field_0xd = 0;
    __return_storage_ptr__->m_u = (anon_union_8_2_07f07f9a_for_m_u)0x0;
    uVar4 = mesh_point_id[mesh_Vi];
    uVar1 = mesh_point_id[mesh_Vj];
    uVar3 = uVar1;
    if ((uVar4 < uVar1) || (bVar2 = uVar1 < uVar4, uVar3 = uVar4, uVar4 = uVar1, bVar2)) {
      (__return_storage_ptr__->m_u).mesh_edge_topology_id.i = uVar4;
      (__return_storage_ptr__->m_u).mesh_edge_topology_id.j = uVar3;
      __return_storage_ptr__->m_u_status = '\x01';
      __return_storage_ptr__->m_mesh_Vi = mesh_Vi;
      __return_storage_ptr__->m_mesh_Vj = mesh_Vj;
      __return_storage_ptr__->m_sud_face_id = candidate_sud_face_id;
      return __return_storage_ptr__;
    }
  }
  ON_SubDIncrementErrorCount();
  __return_storage_ptr__->m_sud_face_id = 0;
  __return_storage_ptr__->m_mesh_Vi = 0;
  __return_storage_ptr__->m_mesh_Vj = 0;
  __return_storage_ptr__->m_u_status = '\0';
  *(undefined3 *)&__return_storage_ptr__->field_0xd = 0;
  __return_storage_ptr__->m_u = (anon_union_8_2_07f07f9a_for_m_u)0x0;
  return __return_storage_ptr__;
}

Assistant:

const ON_MeshNGonEdge ON_MeshNGonEdge::Create(
  unsigned candidate_sud_face_id,
  unsigned mesh_Vi,
  unsigned mesh_Vj,
  const unsigned int* mesh_point_id
)
{
  for(;;)
  {
    if (candidate_sud_face_id <= 0)
      break;
    if (mesh_Vi == mesh_Vj)
      break;
    ON_MeshNGonEdge e = ON_MeshNGonEdge::Unset;
    const unsigned a = mesh_point_id[mesh_Vi];
    const unsigned b = mesh_point_id[mesh_Vj];
    if (a < b)
    {
      e.m_u.mesh_edge_topology_id.i = a;
      e.m_u.mesh_edge_topology_id.j = b;
      e.m_u_status = 1;
    }
    else if (a > b)
    {
      e.m_u.mesh_edge_topology_id.i = b;
      e.m_u.mesh_edge_topology_id.j = a;
      e.m_u_status = 1;
    }
    else
      break;
    e.m_mesh_Vi = mesh_Vi;
    e.m_mesh_Vj = mesh_Vj;
    e.m_sud_face_id = candidate_sud_face_id;
    return e;
  }
  return ON_SUBD_RETURN_ERROR(ON_MeshNGonEdge::Unset);
}